

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall
fasttext::HierarchicalSoftmaxLoss::dfs
          (HierarchicalSoftmaxLoss *this,int32_t k,real threshold,int32_t node,real score,
          Predictions *heap,Vector *hidden)

{
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last_00;
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  element_type *peVar4;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_RCX;
  int in_EDX;
  int in_ESI;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_RDI;
  Predictions *in_R8;
  undefined4 in_XMM0_Da;
  float fVar5;
  float in_XMM1_Da;
  real f;
  value_type *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float fVar6;
  Vector *in_stack_ffffffffffffffd0;
  pair<float,_int> *this_00;
  float threshold_00;
  
  fVar6 = in_XMM1_Da;
  fVar5 = std_log(0.0);
  if (fVar5 <= in_XMM1_Da) {
    sVar1 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                      ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                       in_RCX._M_current);
    threshold_00 = fVar6;
    if (sVar1 == (long)in_ESI) {
      pvVar2 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::front
                         ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      fVar5 = pvVar2->first;
      in_stack_ffffffffffffff9c = fVar6;
      if (fVar6 < fVar5) {
        return;
      }
    }
    pvVar3 = std::
             vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             ::operator[]((vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                           *)(in_RDI._M_current + 0xe),(long)in_EDX);
    if ((pvVar3->left == -1) &&
       (pvVar3 = std::
                 vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                 ::operator[]((vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                               *)(in_RDI._M_current + 0xe),(long)in_EDX), pvVar3->right == -1)) {
      this_00 = in_RCX._M_current;
      std::make_pair<float&,int&>(&in_stack_ffffffffffffff68->first,(int *)0x1cc0a8);
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::push_back
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 in_stack_ffffffffffffff68);
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 in_stack_ffffffffffffff68);
      __last_00._M_current._4_4_ = in_stack_ffffffffffffff9c;
      __last_00._M_current._0_4_ = in_stack_ffffffffffffff98;
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                (in_RDI,__last_00,
                 (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)in_RCX._M_current);
      sVar1 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         this_00);
      if ((ulong)(long)in_ESI < sVar1) {
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   in_stack_ffffffffffffff68);
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   in_stack_ffffffffffffff68);
        __last._M_current._4_4_ = in_stack_ffffffffffffff8c;
        __last._M_current._0_4_ = in_stack_ffffffffffffff88;
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  (in_RCX,__last,
                   (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::pop_back
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   0x1cc145);
      }
    }
    else {
      peVar4 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1cc158);
      (*peVar4->_vptr_Matrix[2])(peVar4,in_R8,(long)(in_EDX - (int)in_RDI._M_current[0x11].first));
      std::exp((double)(ulong)(uint)-fVar5);
      std::
      vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
      ::operator[]((vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                    *)(in_RDI._M_current + 0xe),(long)in_EDX);
      std_log(0.0);
      dfs((HierarchicalSoftmaxLoss *)CONCAT44(in_ESI,in_XMM0_Da),in_EDX,threshold_00,
          (int32_t)((ulong)in_RCX._M_current >> 0x20),SUB84(in_RCX._M_current,0),in_R8,
          in_stack_ffffffffffffffd0);
      std::
      vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
      ::operator[]((vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                    *)(in_RDI._M_current + 0xe),(long)in_EDX);
      std_log(0.0);
      dfs((HierarchicalSoftmaxLoss *)CONCAT44(in_ESI,in_XMM0_Da),in_EDX,threshold_00,
          (int32_t)((ulong)in_RCX._M_current >> 0x20),SUB84(in_RCX._M_current,0),in_R8,
          in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::dfs(
    int32_t k,
    real threshold,
    int32_t node,
    real score,
    Predictions& heap,
    const Vector& hidden) const {
  if (score < std_log(threshold)) {
    return;
  }
  if (heap.size() == k && score < heap.front().first) {
    return;
  }

  if (tree_[node].left == -1 && tree_[node].right == -1) {
    heap.push_back(std::make_pair(score, node));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
    return;
  }

  real f = wo_->dotRow(hidden, node - osz_);
  f = 1. / (1 + std::exp(-f));

  dfs(k, threshold, tree_[node].left, score + std_log(1.0 - f), heap, hidden);
  dfs(k, threshold, tree_[node].right, score + std_log(f), heap, hidden);
}